

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall
pbrt::Curve::getPrimBounds(box3f *__return_storage_ptr__,Curve *this,size_t param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pvVar3;
  pointer pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pvVar4 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pvVar4 == pvVar3) {
    fVar7 = -3.4028235e+38;
    fVar8 = -3.4028235e+38;
    fVar9 = 3.4028235e+38;
    fVar10 = 3.4028235e+38;
    fVar6 = 3.4028235e+38;
    fVar5 = -3.4028235e+38;
  }
  else {
    fVar7 = -3.4028235e+38;
    fVar8 = -3.4028235e+38;
    fVar9 = 3.4028235e+38;
    fVar10 = 3.4028235e+38;
    fVar11 = -3.4028235e+38;
    fVar12 = 3.4028235e+38;
    do {
      fVar5 = pvVar4->z;
      fVar6 = fVar5;
      if (fVar12 <= fVar5) {
        fVar6 = fVar12;
      }
      uVar1 = pvVar4->x;
      uVar2 = pvVar4->y;
      fVar7 = (float)(~-(uint)(fVar7 < (float)uVar1) & (uint)fVar7 |
                     uVar1 & -(uint)(fVar7 < (float)uVar1));
      fVar8 = (float)(~-(uint)(fVar8 < (float)uVar2) & (uint)fVar8 |
                     uVar2 & -(uint)(fVar8 < (float)uVar2));
      fVar9 = (float)(~-(uint)((float)uVar1 < fVar9) & (uint)fVar9 |
                     uVar1 & -(uint)((float)uVar1 < fVar9));
      fVar10 = (float)(~-(uint)((float)uVar2 < fVar10) & (uint)fVar10 |
                      uVar2 & -(uint)((float)uVar2 < fVar10));
      if (fVar5 <= fVar11) {
        fVar5 = fVar11;
      }
      pvVar4 = pvVar4 + 1;
      fVar11 = fVar5;
      fVar12 = fVar6;
    } while (pvVar4 != pvVar3);
  }
  fVar11 = this->width1;
  if (this->width1 <= this->width0) {
    fVar11 = this->width0;
  }
  (__return_storage_ptr__->lower).x = fVar9 - fVar11;
  (__return_storage_ptr__->lower).y = fVar10 - fVar11;
  (__return_storage_ptr__->lower).z = fVar6 - fVar11;
  (__return_storage_ptr__->upper).x = fVar11 + fVar7;
  (__return_storage_ptr__->upper).y = fVar11 + fVar8;
  (__return_storage_ptr__->upper).z = fVar11 + fVar5;
  return __return_storage_ptr__;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID */) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(p);
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }